

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ext(DisasContext_conflict6 *ctx,int wordsz,int rd,int rs,int rt,int shift)

{
  int shift_local;
  int rt_local;
  int rs_local;
  int rd_local;
  int wordsz_local;
  DisasContext_conflict6 *ctx_local;
  
  gen_align_bits(ctx,wordsz,rd,rs,rt,wordsz - shift);
  return;
}

Assistant:

static inline void gen_ext(TCGContext *tcg_ctx, TCGv res, TCGv val, int opsize, int sign)
{
    switch (opsize) {
    case OS_BYTE:
        if (sign) {
            tcg_gen_ext8s_i32(tcg_ctx, res, val);
        } else {
            tcg_gen_ext8u_i32(tcg_ctx, res, val);
        }
        break;
    case OS_WORD:
        if (sign) {
            tcg_gen_ext16s_i32(tcg_ctx, res, val);
        } else {
            tcg_gen_ext16u_i32(tcg_ctx, res, val);
        }
        break;
    case OS_LONG:
        tcg_gen_mov_i32(tcg_ctx, res, val);
        break;
    default:
        g_assert_not_reached();
    }
}